

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::parse_cbor_internal
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,bool get_char,cbor_tag_handler_t tag_handler)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  unsigned_long uVar5;
  string_t *result;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  double dVar6;
  string last_token_1;
  double number_9;
  float number_8;
  double val;
  uint half;
  uchar byte2;
  uchar byte1;
  char_int_type byte2_raw;
  char_int_type byte1_raw;
  uint64_t subtype_3;
  uint32_t subtype_2;
  uint16_t subtype_1;
  uint8_t subtype;
  binary_t b_1;
  uint64_t subtype_to_ignore_3;
  uint32_t subtype_to_ignore_2;
  uint16_t subtype_to_ignore_1;
  uint8_t subtype_to_ignore;
  string last_token;
  uint64_t len_7;
  uint32_t len_6;
  uint16_t len_5;
  uint8_t len_4;
  uint64_t len_3;
  uint32_t len_2;
  uint16_t len_1;
  uint8_t len;
  string_t s;
  binary_t b;
  uint64_t number_7;
  uint32_t number_6;
  uint16_t number_5;
  uint8_t number_4;
  uint64_t number_3;
  uint32_t number_2;
  uint16_t number_1;
  uint8_t number;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  cbor_tag_handler_t tag_handler_00;
  size_t in_stack_fffffffffffffbd0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffbd8;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  input_format_t format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  allocator<char> *in_stack_fffffffffffffbf0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffbf8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined2 in_stack_fffffffffffffc0c;
  undefined1 in_stack_fffffffffffffc0e;
  undefined1 in_stack_fffffffffffffc0f;
  string *in_stack_fffffffffffffc10;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  input_format_t iVar9;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  undefined1 in_stack_fffffffffffffc2f;
  double local_3c0;
  byte local_3ab;
  bool local_342;
  bool local_341;
  bool local_340;
  bool local_33f;
  bool local_33e;
  bool local_33d;
  bool local_33c;
  bool local_33b;
  byte local_339;
  undefined5 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd5;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  string *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  input_format_t in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffce9;
  undefined1 in_stack_fffffffffffffcea;
  undefined1 in_stack_fffffffffffffceb;
  undefined1 in_stack_fffffffffffffcec;
  undefined1 in_stack_fffffffffffffced;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  undefined4 in_stack_fffffffffffffcf8;
  allocator<char> local_2f1;
  string local_2f0 [32];
  string local_2d0 [16];
  binary_t *in_stack_fffffffffffffd40;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffd48;
  string local_2b0 [32];
  undefined1 local_290 [40];
  string local_268 [37];
  byte local_243;
  byte local_242;
  undefined1 local_241 [33];
  char *local_220;
  byte local_213;
  byte local_212;
  allocator<char> local_211;
  string local_210 [32];
  float local_1f0;
  allocator<char> local_1e9;
  string local_1e8 [32];
  uint *local_1c8;
  double local_1c0;
  uint local_1b4;
  undefined1 local_1ae;
  undefined1 local_1ad;
  uint local_1ac;
  uint local_1a8;
  undefined4 local_1a4;
  unsigned_long local_1a0;
  uint local_198;
  unsigned_short local_194;
  uchar local_191;
  byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_190
  ;
  undefined8 local_168;
  undefined4 local_160;
  undefined2 local_15c;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  undefined1 local_f8 [40];
  string local_d0 [32];
  unsigned_long local_b0;
  uint local_a8;
  undefined2 local_a4;
  undefined1 local_a1;
  unsigned_long local_a0;
  uint local_98;
  undefined2 local_94;
  undefined1 local_91;
  string local_90 [48];
  undefined1 local_60 [40];
  long local_38;
  uint local_30;
  ushort local_2c;
  byte local_29;
  undefined8 local_28;
  cbor_tag_handler_t in_stack_ffffffffffffffe0;
  undefined4 uVar10;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar11;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar12;
  bool local_1;
  
  iVar9 = (input_format_t)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  tag_handler_00 = (cbor_tag_handler_t)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  uVar12 = CONCAT13(in_SIL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if ((char)(uVar12 >> 0x18) == '\0') {
    iVar4 = *(int *)(in_RDI + 0x10);
  }
  else {
    iVar4 = get(in_stack_fffffffffffffbc0);
  }
  result = (string_t *)(ulong)(iVar4 + 1);
  format = (input_format_t)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  switch(result) {
  case (string_t *)0x0:
    local_1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT17(in_stack_fffffffffffffcef,
                                       CONCAT16(in_stack_fffffffffffffcee,
                                                CONCAT15(in_stack_fffffffffffffced,
                                                         CONCAT14(in_stack_fffffffffffffcec,
                                                                  CONCAT13(in_stack_fffffffffffffceb
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffcea,
                                                  CONCAT11(in_stack_fffffffffffffce9,
                                                           in_stack_fffffffffffffce8))))))),
                           in_stack_fffffffffffffce4,(char *)in_stack_fffffffffffffcd8);
    break;
  case (string_t *)0x1:
  case (string_t *)0x2:
  case (string_t *)0x3:
  case (string_t *)0x4:
  case (string_t *)0x5:
  case (string_t *)0x6:
  case (string_t *)0x7:
  case (string_t *)0x8:
  case (string_t *)0x9:
  case (string_t *)0xa:
  case (string_t *)0xb:
  case (string_t *)0xc:
  case (string_t *)0xd:
  case (string_t *)0xe:
  case (string_t *)0xf:
  case (string_t *)0x10:
  case (string_t *)0x11:
  case (string_t *)0x12:
  case (string_t *)0x13:
  case (string_t *)0x14:
  case (string_t *)0x15:
  case (string_t *)0x16:
  case (string_t *)0x17:
  case (string_t *)0x18:
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))
                      (*(long **)(in_RDI + 0x28),(long)*(int *)(in_RDI + 0x10));
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x19:
    uVar11 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uchar *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),uVar11);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x1a:
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_short,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_short *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x1b:
    uVar10 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uint *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),uVar10);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x1c:
    local_28 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_long,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_long *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),local_28);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  default:
    get_token_string((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                      *)CONCAT17(in_stack_fffffffffffffc0f,
                                 CONCAT16(in_stack_fffffffffffffc0e,
                                          CONCAT24(in_stack_fffffffffffffc0c,
                                                   in_stack_fffffffffffffc08))));
    pbVar8 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x18);
    plVar7 = *(long **)(in_RDI + 0x28);
    concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string&>
              ((char (*) [17])CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),pbVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    exception_message((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                       *)CONCAT17(in_stack_fffffffffffffc2f,
                                  CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
                      iVar9,(string *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    parse_error::create<std::nullptr_t,_0>
              (CONCAT13(in_stack_fffffffffffffcef,
                        CONCAT12(in_stack_fffffffffffffcee,
                                 CONCAT11(in_stack_fffffffffffffced,in_stack_fffffffffffffcec))),
               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8,
               (void *)CONCAT17(in_stack_fffffffffffffcd7,
                                CONCAT16(in_stack_fffffffffffffcd6,
                                         CONCAT15(in_stack_fffffffffffffcd5,
                                                  in_stack_fffffffffffffcd0))));
    bVar3 = (**(code **)(*plVar7 + 0x60))(plVar7,pbVar8,local_268,local_290);
    local_1 = (bool)(bVar3 & 1);
    parse_error::~parse_error((parse_error *)0x2c3659);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    std::__cxx11::string::~string(local_2d0);
    local_1a4 = 1;
    std::__cxx11::string::~string(local_268);
    break;
  case (string_t *)0x21:
  case (string_t *)0x22:
  case (string_t *)0x23:
  case (string_t *)0x24:
  case (string_t *)0x25:
  case (string_t *)0x26:
  case (string_t *)0x27:
  case (string_t *)0x28:
  case (string_t *)0x29:
  case (string_t *)0x2a:
  case (string_t *)0x2b:
  case (string_t *)0x2c:
  case (string_t *)0x2d:
  case (string_t *)0x2e:
  case (string_t *)0x2f:
  case (string_t *)0x30:
  case (string_t *)0x31:
  case (string_t *)0x32:
  case (string_t *)0x33:
  case (string_t *)0x34:
  case (string_t *)0x35:
  case (string_t *)0x36:
  case (string_t *)0x37:
  case (string_t *)0x38:
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                      (*(long **)(in_RDI + 0x28),
                       (long)(char)('\x1f' - (char)*(undefined4 *)(in_RDI + 0x10)));
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x39:
    local_29 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uchar *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                        (*(long **)(in_RDI + 0x28),-1 - (ulong)local_29);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x3a:
    local_2c = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_short,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_short *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                        (*(long **)(in_RDI + 0x28),-1 - (ulong)local_2c);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x3b:
    local_30 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uint *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                        (*(long **)(in_RDI + 0x28),-1 - (ulong)local_30);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x3c:
    local_38 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_long,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_long *)in_stack_fffffffffffffbd8);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                        (*(long **)(in_RDI + 0x28),-1 - local_38);
    }
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0x41:
  case (string_t *)0x42:
  case (string_t *)0x43:
  case (string_t *)0x44:
  case (string_t *)0x45:
  case (string_t *)0x46:
  case (string_t *)0x47:
  case (string_t *)0x48:
  case (string_t *)0x49:
  case (string_t *)0x4a:
  case (string_t *)0x4b:
  case (string_t *)0x4c:
  case (string_t *)0x4d:
  case (string_t *)0x4e:
  case (string_t *)0x4f:
  case (string_t *)0x50:
  case (string_t *)0x51:
  case (string_t *)0x52:
  case (string_t *)0x53:
  case (string_t *)0x54:
  case (string_t *)0x55:
  case (string_t *)0x56:
  case (string_t *)0x57:
  case (string_t *)0x58:
  case (string_t *)0x59:
  case (string_t *)0x5a:
  case (string_t *)0x5b:
  case (string_t *)0x5c:
  case (string_t *)0x60:
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffbc0);
    bVar2 = get_cbor_binary(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    bVar3 = 0;
    if (bVar2) {
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))(*(long **)(in_RDI + 0x28),local_60);
    }
    local_1 = (bool)(bVar3 & 1);
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x2c2429);
    break;
  case (string_t *)0x61:
  case (string_t *)0x62:
  case (string_t *)0x63:
  case (string_t *)0x64:
  case (string_t *)0x65:
  case (string_t *)0x66:
  case (string_t *)0x67:
  case (string_t *)0x68:
  case (string_t *)0x69:
  case (string_t *)0x6a:
  case (string_t *)0x6b:
  case (string_t *)0x6c:
  case (string_t *)0x6d:
  case (string_t *)0x6e:
  case (string_t *)0x6f:
  case (string_t *)0x70:
  case (string_t *)0x71:
  case (string_t *)0x72:
  case (string_t *)0x73:
  case (string_t *)0x74:
  case (string_t *)0x75:
  case (string_t *)0x76:
  case (string_t *)0x77:
  case (string_t *)0x78:
  case (string_t *)0x79:
  case (string_t *)0x7a:
  case (string_t *)0x7b:
  case (string_t *)0x7c:
  case (string_t *)0x80:
    std::__cxx11::string::string(local_90);
    bVar2 = get_cbor_string((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                             *)CONCAT44(iVar4,in_stack_fffffffffffffcf8),result);
    local_339 = 0;
    if (bVar2) {
      local_339 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                            (*(long **)(in_RDI + 0x28),local_90);
    }
    local_1 = (bool)(local_339 & 1);
    std::__cxx11::string::~string(local_90);
    break;
  case (string_t *)0x81:
  case (string_t *)0x82:
  case (string_t *)0x83:
  case (string_t *)0x84:
  case (string_t *)0x85:
  case (string_t *)0x86:
  case (string_t *)0x87:
  case (string_t *)0x88:
  case (string_t *)0x89:
  case (string_t *)0x8a:
  case (string_t *)0x8b:
  case (string_t *)0x8c:
  case (string_t *)0x8d:
  case (string_t *)0x8e:
  case (string_t *)0x8f:
  case (string_t *)0x90:
  case (string_t *)0x91:
  case (string_t *)0x92:
  case (string_t *)0x93:
  case (string_t *)0x94:
  case (string_t *)0x95:
  case (string_t *)0x96:
  case (string_t *)0x97:
  case (string_t *)0x98:
    conditional_static_cast<unsigned_long,_unsigned_int,_0>(*(uint *)(in_RDI + 0x10) & 0x1f);
    local_1 = get_cbor_array(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,tag_handler_00);
    break;
  case (string_t *)0x99:
    local_91 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uchar *)in_stack_fffffffffffffbd8);
    local_33b = false;
    if (bVar2) {
      local_33b = get_cbor_array(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,tag_handler_00)
      ;
    }
    local_1 = local_33b;
    break;
  case (string_t *)0x9a:
    local_94 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_short,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_short *)in_stack_fffffffffffffbd8);
    local_33c = false;
    if (bVar2) {
      local_33c = get_cbor_array(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,tag_handler_00)
      ;
    }
    local_1 = local_33c;
    break;
  case (string_t *)0x9b:
    local_98 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uint *)in_stack_fffffffffffffbd8);
    local_33d = false;
    if (bVar2) {
      conditional_static_cast<unsigned_long,_unsigned_int,_0>(local_98);
      local_33d = get_cbor_array(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,tag_handler_00)
      ;
    }
    local_1 = local_33d;
    break;
  case (string_t *)0x9c:
    local_a0 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_long,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_long *)in_stack_fffffffffffffbd8);
    local_33e = false;
    if (bVar2) {
      conditional_static_cast<unsigned_long,_unsigned_long,_0>(local_a0);
      local_33e = get_cbor_array(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,tag_handler_00)
      ;
    }
    local_1 = local_33e;
    break;
  case (string_t *)0xa0:
    local_1 = get_cbor_array(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,tag_handler_00);
    break;
  case (string_t *)0xa1:
  case (string_t *)0xa2:
  case (string_t *)0xa3:
  case (string_t *)0xa4:
  case (string_t *)0xa5:
  case (string_t *)0xa6:
  case (string_t *)0xa7:
  case (string_t *)0xa8:
  case (string_t *)0xa9:
  case (string_t *)0xaa:
  case (string_t *)0xab:
  case (string_t *)0xac:
  case (string_t *)0xad:
  case (string_t *)0xae:
  case (string_t *)0xaf:
  case (string_t *)0xb0:
  case (string_t *)0xb1:
  case (string_t *)0xb2:
  case (string_t *)0xb3:
  case (string_t *)0xb4:
  case (string_t *)0xb5:
  case (string_t *)0xb6:
  case (string_t *)0xb7:
  case (string_t *)0xb8:
    conditional_static_cast<unsigned_long,_unsigned_int,_0>(*(uint *)(in_RDI + 0x10) & 0x1f);
    local_1 = get_cbor_object(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,
                              CONCAT13(in_stack_fffffffffffffc0f,
                                       CONCAT12(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc0c)
                                      ));
    break;
  case (string_t *)0xb9:
    local_a1 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uchar *)in_stack_fffffffffffffbd8);
    local_33f = false;
    if (bVar2) {
      local_33f = get_cbor_object(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,
                                  CONCAT13(in_stack_fffffffffffffc0f,
                                           CONCAT12(in_stack_fffffffffffffc0e,
                                                    in_stack_fffffffffffffc0c)));
    }
    local_1 = local_33f;
    break;
  case (string_t *)0xba:
    local_a4 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_short,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_short *)in_stack_fffffffffffffbd8);
    local_340 = false;
    if (bVar2) {
      local_340 = get_cbor_object(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,
                                  CONCAT13(in_stack_fffffffffffffc0f,
                                           CONCAT12(in_stack_fffffffffffffc0e,
                                                    in_stack_fffffffffffffc0c)));
    }
    local_1 = local_340;
    break;
  case (string_t *)0xbb:
    local_a8 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (uint *)in_stack_fffffffffffffbd8);
    local_341 = false;
    if (bVar2) {
      conditional_static_cast<unsigned_long,_unsigned_int,_0>(local_a8);
      local_341 = get_cbor_object(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,
                                  CONCAT13(in_stack_fffffffffffffc0f,
                                           CONCAT12(in_stack_fffffffffffffc0e,
                                                    in_stack_fffffffffffffc0c)));
    }
    local_1 = local_341;
    break;
  case (string_t *)0xbc:
    local_b0 = 0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_long,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (unsigned_long *)in_stack_fffffffffffffbd8);
    local_342 = false;
    if (bVar2) {
      conditional_static_cast<unsigned_long,_unsigned_long,_0>(local_b0);
      local_342 = get_cbor_object(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,
                                  CONCAT13(in_stack_fffffffffffffc0f,
                                           CONCAT12(in_stack_fffffffffffffc0e,
                                                    in_stack_fffffffffffffc0c)));
    }
    local_1 = local_342;
    break;
  case (string_t *)0xc0:
    local_1 = get_cbor_object(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10,
                              CONCAT13(in_stack_fffffffffffffc0f,
                                       CONCAT12(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc0c)
                                      ));
    break;
  case (string_t *)0xc7:
  case (string_t *)0xc8:
  case (string_t *)0xc9:
  case (string_t *)0xca:
  case (string_t *)0xcb:
  case (string_t *)0xcc:
  case (string_t *)0xcd:
  case (string_t *)0xce:
  case (string_t *)0xcf:
  case (string_t *)0xd0:
  case (string_t *)0xd1:
  case (string_t *)0xd2:
  case (string_t *)0xd3:
  case (string_t *)0xd4:
  case (string_t *)0xd5:
  case (string_t *)0xd9:
  case (string_t *)0xda:
  case (string_t *)0xdb:
  case (string_t *)0xdc:
    if (in_EDX == 0) {
      get_token_string((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffc0f,
                                   CONCAT16(in_stack_fffffffffffffc0e,
                                            CONCAT24(in_stack_fffffffffffffc0c,
                                                     in_stack_fffffffffffffc08))));
      uVar1 = *(undefined8 *)(in_RDI + 0x18);
      plVar7 = *(long **)(in_RDI + 0x28);
      concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string&>
                ((char (*) [17])CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                 in_stack_fffffffffffffbe0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      exception_message((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                         *)CONCAT17(in_stack_fffffffffffffc2f,
                                    CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
                        iVar9,(string *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      parse_error::create<std::nullptr_t,_0>
                (CONCAT13(in_stack_fffffffffffffcef,
                          CONCAT12(in_stack_fffffffffffffcee,
                                   CONCAT11(in_stack_fffffffffffffced,in_stack_fffffffffffffcec))),
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcd8,
                 (void *)CONCAT17(in_stack_fffffffffffffcd7,
                                  CONCAT16(in_stack_fffffffffffffcd6,
                                           CONCAT15(in_stack_fffffffffffffcd5,
                                                    in_stack_fffffffffffffcd0))));
      bVar3 = (**(code **)(*plVar7 + 0x60))(plVar7,uVar1,local_d0,local_f8);
      parse_error::~parse_error((parse_error *)0x2c2aeb);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_159);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_d0);
      return (bool)(bVar3 & 1);
    }
    if (in_EDX == 1) {
      switch(*(undefined4 *)(in_RDI + 0x10)) {
      case 0xd8:
        local_15a = 0;
        binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
        ::get_number<unsigned_char,false>
                  ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                   (uchar *)in_stack_fffffffffffffbd8);
        break;
      case 0xd9:
        local_15c = 0;
        binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
        ::get_number<unsigned_short,false>
                  ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                   (unsigned_short *)in_stack_fffffffffffffbd8);
        break;
      case 0xda:
        local_160 = 0;
        binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
        ::get_number<unsigned_int,false>
                  ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                   (uint *)in_stack_fffffffffffffbd8);
        break;
      case 0xdb:
        local_168 = 0;
        binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
        ::get_number<unsigned_long,false>
                  ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                   (unsigned_long *)in_stack_fffffffffffffbd8);
      }
      bVar2 = parse_cbor_internal((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                                   *)CONCAT44(uVar12,in_EDX),(bool)in_stack_ffffffffffffffe7,
                                  in_stack_ffffffffffffffe0);
      return bVar2;
    }
    if (in_EDX != 2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,0x26ea,"GGML_ASSERT(%s) failed","false");
      goto switchD_002c1f88_caseD_f5;
    }
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffbc0);
    iVar9 = (input_format_t)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
    switch(*(undefined4 *)(in_RDI + 0x10)) {
    case 0xd8:
      local_191 = '\0';
      binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
      ::get_number<unsigned_char,false>
                ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                  *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),iVar9,
                 (uchar *)in_stack_fffffffffffffbd8);
      uVar5 = conditional_static_cast<unsigned_long,_unsigned_char,_0>(local_191);
      byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      set_subtype(&local_190,uVar5);
      break;
    case 0xd9:
      local_194 = 0;
      binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
      ::get_number<unsigned_short,false>
                ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                  *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),iVar9,
                 (unsigned_short *)in_stack_fffffffffffffbd8);
      uVar5 = conditional_static_cast<unsigned_long,_unsigned_short,_0>(local_194);
      byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      set_subtype(&local_190,uVar5);
      break;
    case 0xda:
      local_198 = 0;
      binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
      ::get_number<unsigned_int,false>
                ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                  *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),iVar9,
                 (uint *)in_stack_fffffffffffffbd8);
      uVar5 = conditional_static_cast<unsigned_long,_unsigned_int,_0>(local_198);
      byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      set_subtype(&local_190,uVar5);
      break;
    case 0xdb:
      local_1a0 = 0;
      binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
      ::get_number<unsigned_long,false>
                ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                  *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),iVar9,
                 (unsigned_long *)in_stack_fffffffffffffbd8);
      uVar5 = conditional_static_cast<unsigned_long,_unsigned_long,_0>(local_1a0);
      byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      set_subtype(&local_190,uVar5);
      break;
    default:
      local_1 = parse_cbor_internal((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                                     *)CONCAT44(uVar12,in_EDX),(bool)in_stack_ffffffffffffffe7,
                                    in_stack_ffffffffffffffe0);
      goto LAB_002c2f8e;
    }
    get(in_stack_fffffffffffffbc0);
    bVar2 = get_cbor_binary(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    local_3ab = 0;
    if (bVar2) {
      local_3ab = (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))
                            (*(long **)(in_RDI + 0x28),&local_190);
    }
    local_1 = (bool)(local_3ab & 1);
LAB_002c2f8e:
    local_1a4 = 1;
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x2c2f9b);
    break;
  case (string_t *)0xf5:
switchD_002c1f88_caseD_f5:
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),0);
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0xf6:
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),1);
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0xf7:
    bVar3 = (**(code **)**(undefined8 **)(in_RDI + 0x28))();
    local_1 = (bool)(bVar3 & 1);
    break;
  case (string_t *)0xfa:
    local_1a8 = get(in_stack_fffffffffffffbc0);
    bVar2 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffffcef,
                                     CONCAT16(in_stack_fffffffffffffcee,
                                              CONCAT15(in_stack_fffffffffffffced,
                                                       CONCAT14(in_stack_fffffffffffffcec,
                                                                CONCAT13(in_stack_fffffffffffffceb,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffcea,
                                                  CONCAT11(in_stack_fffffffffffffce9,
                                                           in_stack_fffffffffffffce8))))))),
                         in_stack_fffffffffffffce4,(char *)in_stack_fffffffffffffcd8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_1ac = get(in_stack_fffffffffffffbc0);
      bVar2 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT17(in_stack_fffffffffffffcef,
                                       CONCAT16(in_stack_fffffffffffffcee,
                                                CONCAT15(in_stack_fffffffffffffced,
                                                         CONCAT14(in_stack_fffffffffffffcec,
                                                                  CONCAT13(in_stack_fffffffffffffceb
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffcea,
                                                  CONCAT11(in_stack_fffffffffffffce9,
                                                           in_stack_fffffffffffffce8))))))),
                           in_stack_fffffffffffffce4,(char *)in_stack_fffffffffffffcd8);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        local_1ad = (undefined1)local_1a8;
        local_1ae = (undefined1)local_1ac;
        local_1b4 = (local_1a8 & 0xff) * 0x100 + (local_1ac & 0xff);
        local_1c8 = &local_1b4;
        local_1c0 = parse_cbor_internal::anon_class_8_1_898c6d31::operator()
                              ((anon_class_8_1_898c6d31 *)
                               CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
        plVar7 = *(long **)(in_RDI + 0x28);
        local_3c0 = local_1c0;
        if ((local_1b4 & 0x8000) != 0) {
          local_3c0 = -local_1c0;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        bVar3 = (**(code **)(*plVar7 + 0x20))(local_3c0,plVar7,local_1e8);
        local_1 = (bool)(bVar3 & 1);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
    break;
  case (string_t *)0xfb:
    local_1f0 = 0.0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<float,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (float *)in_stack_fffffffffffffbd8);
    local_212 = 0;
    local_213 = 0;
    bVar3 = 0;
    if (bVar2) {
      plVar7 = *(long **)(in_RDI + 0x28);
      dVar6 = (double)local_1f0;
      std::allocator<char>::allocator();
      local_212 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      local_213 = 1;
      bVar3 = (**(code **)(*plVar7 + 0x20))(dVar6,plVar7,local_210);
    }
    local_1 = (bool)(bVar3 & 1);
    if ((local_213 & 1) != 0) {
      std::__cxx11::string::~string(local_210);
    }
    if ((local_212 & 1) != 0) {
      std::allocator<char>::~allocator(&local_211);
    }
    break;
  case (string_t *)0xfc:
    local_220 = (char *)0x0;
    bVar2 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<double,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),format,
                       (double *)in_stack_fffffffffffffbd8);
    local_242 = 0;
    local_243 = 0;
    bVar3 = 0;
    if (bVar2) {
      __a = *(allocator<char> **)(in_RDI + 0x28);
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_241;
      __s = local_220;
      std::allocator<char>::allocator();
      local_242 = 1;
      std::__cxx11::string::string<std::allocator<char>>(pbVar8,__s,__a);
      local_243 = 1;
      bVar3 = (**(code **)(*(long *)__a + 0x20))(__s,__a,local_241 + 1);
    }
    local_1 = (bool)(bVar3 & 1);
    if ((local_243 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_241 + 1));
    }
    if ((local_242 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_241);
    }
  }
  return local_1;
}

Assistant:

bool parse_cbor_internal(const bool get_char,
                             const cbor_tag_handler_t tag_handler)
    {
        switch (get_char ? get() : current)
        {
            // EOF
            case char_traits<char_type>::eof():
                return unexpect_eof(input_format_t::cbor, "value");

            // Integer 0x00..0x17 (0..23)
            case 0x00:
            case 0x01:
            case 0x02:
            case 0x03:
            case 0x04:
            case 0x05:
            case 0x06:
            case 0x07:
            case 0x08:
            case 0x09:
            case 0x0A:
            case 0x0B:
            case 0x0C:
            case 0x0D:
            case 0x0E:
            case 0x0F:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x14:
            case 0x15:
            case 0x16:
            case 0x17:
                return sax->number_unsigned(static_cast<number_unsigned_t>(current));

            case 0x18: // Unsigned integer (one-byte uint8_t follows)
            {
                std::uint8_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_unsigned(number);
            }

            case 0x19: // Unsigned integer (two-byte uint16_t follows)
            {
                std::uint16_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_unsigned(number);
            }

            case 0x1A: // Unsigned integer (four-byte uint32_t follows)
            {
                std::uint32_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_unsigned(number);
            }

            case 0x1B: // Unsigned integer (eight-byte uint64_t follows)
            {
                std::uint64_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_unsigned(number);
            }

            // Negative integer -1-0x00..-1-0x17 (-1..-24)
            case 0x20:
            case 0x21:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x28:
            case 0x29:
            case 0x2A:
            case 0x2B:
            case 0x2C:
            case 0x2D:
            case 0x2E:
            case 0x2F:
            case 0x30:
            case 0x31:
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
            case 0x36:
            case 0x37:
                return sax->number_integer(static_cast<std::int8_t>(0x20 - 1 - current));

            case 0x38: // Negative integer (one-byte uint8_t follows)
            {
                std::uint8_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_integer(static_cast<number_integer_t>(-1) - number);
            }

            case 0x39: // Negative integer -1-n (two-byte uint16_t follows)
            {
                std::uint16_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_integer(static_cast<number_integer_t>(-1) - number);
            }

            case 0x3A: // Negative integer -1-n (four-byte uint32_t follows)
            {
                std::uint32_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_integer(static_cast<number_integer_t>(-1) - number);
            }

            case 0x3B: // Negative integer -1-n (eight-byte uint64_t follows)
            {
                std::uint64_t number{};
                return get_number(input_format_t::cbor, number) && sax->number_integer(static_cast<number_integer_t>(-1)
                        - static_cast<number_integer_t>(number));
            }

            // Binary data (0x00..0x17 bytes follow)
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4A:
            case 0x4B:
            case 0x4C:
            case 0x4D:
            case 0x4E:
            case 0x4F:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            case 0x58: // Binary data (one-byte uint8_t for n follows)
            case 0x59: // Binary data (two-byte uint16_t for n follow)
            case 0x5A: // Binary data (four-byte uint32_t for n follow)
            case 0x5B: // Binary data (eight-byte uint64_t for n follow)
            case 0x5F: // Binary data (indefinite length)
            {
                binary_t b;
                return get_cbor_binary(b) && sax->binary(b);
            }

            // UTF-8 string (0x00..0x17 bytes follow)
            case 0x60:
            case 0x61:
            case 0x62:
            case 0x63:
            case 0x64:
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x68:
            case 0x69:
            case 0x6A:
            case 0x6B:
            case 0x6C:
            case 0x6D:
            case 0x6E:
            case 0x6F:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x73:
            case 0x74:
            case 0x75:
            case 0x76:
            case 0x77:
            case 0x78: // UTF-8 string (one-byte uint8_t for n follows)
            case 0x79: // UTF-8 string (two-byte uint16_t for n follow)
            case 0x7A: // UTF-8 string (four-byte uint32_t for n follow)
            case 0x7B: // UTF-8 string (eight-byte uint64_t for n follow)
            case 0x7F: // UTF-8 string (indefinite length)
            {
                string_t s;
                return get_cbor_string(s) && sax->string(s);
            }

            // array (0x00..0x17 data items follow)
            case 0x80:
            case 0x81:
            case 0x82:
            case 0x83:
            case 0x84:
            case 0x85:
            case 0x86:
            case 0x87:
            case 0x88:
            case 0x89:
            case 0x8A:
            case 0x8B:
            case 0x8C:
            case 0x8D:
            case 0x8E:
            case 0x8F:
            case 0x90:
            case 0x91:
            case 0x92:
            case 0x93:
            case 0x94:
            case 0x95:
            case 0x96:
            case 0x97:
                return get_cbor_array(
                           conditional_static_cast<std::size_t>(static_cast<unsigned int>(current) & 0x1Fu), tag_handler);

            case 0x98: // array (one-byte uint8_t for n follows)
            {
                std::uint8_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_array(static_cast<std::size_t>(len), tag_handler);
            }

            case 0x99: // array (two-byte uint16_t for n follow)
            {
                std::uint16_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_array(static_cast<std::size_t>(len), tag_handler);
            }

            case 0x9A: // array (four-byte uint32_t for n follow)
            {
                std::uint32_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_array(conditional_static_cast<std::size_t>(len), tag_handler);
            }

            case 0x9B: // array (eight-byte uint64_t for n follow)
            {
                std::uint64_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_array(conditional_static_cast<std::size_t>(len), tag_handler);
            }

            case 0x9F: // array (indefinite length)
                return get_cbor_array(static_cast<std::size_t>(-1), tag_handler);

            // map (0x00..0x17 pairs of data items follow)
            case 0xA0:
            case 0xA1:
            case 0xA2:
            case 0xA3:
            case 0xA4:
            case 0xA5:
            case 0xA6:
            case 0xA7:
            case 0xA8:
            case 0xA9:
            case 0xAA:
            case 0xAB:
            case 0xAC:
            case 0xAD:
            case 0xAE:
            case 0xAF:
            case 0xB0:
            case 0xB1:
            case 0xB2:
            case 0xB3:
            case 0xB4:
            case 0xB5:
            case 0xB6:
            case 0xB7:
                return get_cbor_object(conditional_static_cast<std::size_t>(static_cast<unsigned int>(current) & 0x1Fu), tag_handler);

            case 0xB8: // map (one-byte uint8_t for n follows)
            {
                std::uint8_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_object(static_cast<std::size_t>(len), tag_handler);
            }

            case 0xB9: // map (two-byte uint16_t for n follow)
            {
                std::uint16_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_object(static_cast<std::size_t>(len), tag_handler);
            }

            case 0xBA: // map (four-byte uint32_t for n follow)
            {
                std::uint32_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_object(conditional_static_cast<std::size_t>(len), tag_handler);
            }

            case 0xBB: // map (eight-byte uint64_t for n follow)
            {
                std::uint64_t len{};
                return get_number(input_format_t::cbor, len) && get_cbor_object(conditional_static_cast<std::size_t>(len), tag_handler);
            }

            case 0xBF: // map (indefinite length)
                return get_cbor_object(static_cast<std::size_t>(-1), tag_handler);

            case 0xC6: // tagged item
            case 0xC7:
            case 0xC8:
            case 0xC9:
            case 0xCA:
            case 0xCB:
            case 0xCC:
            case 0xCD:
            case 0xCE:
            case 0xCF:
            case 0xD0:
            case 0xD1:
            case 0xD2:
            case 0xD3:
            case 0xD4:
            case 0xD8: // tagged item (1 bytes follow)
            case 0xD9: // tagged item (2 bytes follow)
            case 0xDA: // tagged item (4 bytes follow)
            case 0xDB: // tagged item (8 bytes follow)
            {
                switch (tag_handler)
                {
                    case cbor_tag_handler_t::error:
                    {
                        auto last_token = get_token_string();
                        return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                                exception_message(input_format_t::cbor, concat("invalid byte: 0x", last_token), "value"), nullptr));
                    }

                    case cbor_tag_handler_t::ignore:
                    {
                        // ignore binary subtype
                        switch (current)
                        {
                            case 0xD8:
                            {
                                std::uint8_t subtype_to_ignore{};
                                get_number(input_format_t::cbor, subtype_to_ignore);
                                break;
                            }
                            case 0xD9:
                            {
                                std::uint16_t subtype_to_ignore{};
                                get_number(input_format_t::cbor, subtype_to_ignore);
                                break;
                            }
                            case 0xDA:
                            {
                                std::uint32_t subtype_to_ignore{};
                                get_number(input_format_t::cbor, subtype_to_ignore);
                                break;
                            }
                            case 0xDB:
                            {
                                std::uint64_t subtype_to_ignore{};
                                get_number(input_format_t::cbor, subtype_to_ignore);
                                break;
                            }
                            default:
                                break;
                        }
                        return parse_cbor_internal(true, tag_handler);
                    }

                    case cbor_tag_handler_t::store:
                    {
                        binary_t b;
                        // use binary subtype and store in binary container
                        switch (current)
                        {
                            case 0xD8:
                            {
                                std::uint8_t subtype{};
                                get_number(input_format_t::cbor, subtype);
                                b.set_subtype(detail::conditional_static_cast<typename binary_t::subtype_type>(subtype));
                                break;
                            }
                            case 0xD9:
                            {
                                std::uint16_t subtype{};
                                get_number(input_format_t::cbor, subtype);
                                b.set_subtype(detail::conditional_static_cast<typename binary_t::subtype_type>(subtype));
                                break;
                            }
                            case 0xDA:
                            {
                                std::uint32_t subtype{};
                                get_number(input_format_t::cbor, subtype);
                                b.set_subtype(detail::conditional_static_cast<typename binary_t::subtype_type>(subtype));
                                break;
                            }
                            case 0xDB:
                            {
                                std::uint64_t subtype{};
                                get_number(input_format_t::cbor, subtype);
                                b.set_subtype(detail::conditional_static_cast<typename binary_t::subtype_type>(subtype));
                                break;
                            }
                            default:
                                return parse_cbor_internal(true, tag_handler);
                        }
                        get();
                        return get_cbor_binary(b) && sax->binary(b);
                    }

                    default:                 // LCOV_EXCL_LINE
                        JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
                        return false;        // LCOV_EXCL_LINE
                }
            }

            case 0xF4: // false
                return sax->boolean(false);

            case 0xF5: // true
                return sax->boolean(true);

            case 0xF6: // null
                return sax->null();

            case 0xF9: // Half-Precision Float (two-byte IEEE 754)
            {
                const auto byte1_raw = get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::cbor, "number")))
                {
                    return false;
                }
                const auto byte2_raw = get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::cbor, "number")))
                {
                    return false;
                }

                const auto byte1 = static_cast<unsigned char>(byte1_raw);
                const auto byte2 = static_cast<unsigned char>(byte2_raw);

                // code from RFC 7049, Appendix D, Figure 3:
                // As half-precision floating-point numbers were only added
                // to IEEE 754 in 2008, today's programming platforms often
                // still only have limited support for them. It is very
                // easy to include at least decoding support for them even
                // without such support. An example of a small decoder for
                // half-precision floating-point numbers in the C language
                // is shown in Fig. 3.
                const auto half = static_cast<unsigned int>((byte1 << 8u) + byte2);
                const double val = [&half]
                {
                    const int exp = (half >> 10u) & 0x1Fu;
                    const unsigned int mant = half & 0x3FFu;
                    JSON_ASSERT(0 <= exp&& exp <= 32);
                    JSON_ASSERT(mant <= 1024);
                    switch (exp)
                    {
                        case 0:
                            return std::ldexp(mant, -24);
                        case 31:
                            return (mant == 0)
                            ? std::numeric_limits<double>::infinity()
                            : std::numeric_limits<double>::quiet_NaN();
                        default:
                            return std::ldexp(mant + 1024, exp - 25);
                    }
                }();
                return sax->number_float((half & 0x8000u) != 0
                                         ? static_cast<number_float_t>(-val)
                                         : static_cast<number_float_t>(val), "");
            }

            case 0xFA: // Single-Precision Float (four-byte IEEE 754)
            {
                float number{};
                return get_number(input_format_t::cbor, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0xFB: // Double-Precision Float (eight-byte IEEE 754)
            {
                double number{};
                return get_number(input_format_t::cbor, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            default: // anything else (0xFF is handled inside the other types)
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                        exception_message(input_format_t::cbor, concat("invalid byte: 0x", last_token), "value"), nullptr));
            }
        }
    }